

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileParser::getHomogeneousVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *pBuffer;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  DeadlyImportError *this_00;
  ai_real aVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  allocator<char> local_6d;
  ai_real local_6c;
  ai_real local_68;
  undefined4 uStack_64;
  ai_real local_58;
  undefined4 uStack_54;
  undefined4 uStack_4c;
  undefined1 local_40 [32];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  local_58 = fast_atof(pBuffer);
  uStack_54 = extraout_XMM0_Db;
  uStack_4c = extraout_XMM0_Dd;
  copyNextWord(this,pBuffer,0x1000);
  local_68 = fast_atof(pBuffer);
  uStack_64 = extraout_XMM0_Db_00;
  copyNextWord(this,pBuffer,0x1000);
  local_6c = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  aVar2 = fast_atof(pBuffer);
  if ((aVar2 == 0.0) && (!NAN(aVar2))) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"OBJ: Invalid component in homogeneous vector (Division by zero)",
               &local_6d);
    DeadlyImportError::DeadlyImportError(this_00,(string *)local_40);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar4._4_4_ = uStack_54;
  auVar4._0_4_ = local_58;
  auVar4._8_4_ = uStack_54;
  auVar4._12_4_ = uStack_4c;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._4_4_ = local_68;
  auVar3._0_4_ = local_58;
  auVar5._0_12_ = auVar3._0_12_;
  auVar5._12_4_ = uStack_64;
  auVar6._4_4_ = aVar2;
  auVar6._0_4_ = aVar2;
  auVar6._8_4_ = extraout_XMM0_Db_01;
  auVar6._12_4_ = extraout_XMM0_Db_01;
  auVar6 = divps(auVar5,auVar6);
  local_40._8_4_ = local_6c / aVar2;
  local_40._0_8_ = auVar6._0_8_;
  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::emplace_back<aiVector3t<float>>
            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
             (aiVector3t<float> *)local_40);
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getHomogeneousVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z, w;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    copyNextWord( m_buffer, Buffersize );
    w = ( ai_real ) fast_atof( m_buffer );

    if (w == 0)
      throw DeadlyImportError("OBJ: Invalid component in homogeneous vector (Division by zero)");

    point3d_array.push_back( aiVector3D( x/w, y/w, z/w ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}